

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseWheel(void)

{
  ImVec2 IVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float scroll_step_1;
  float max_step_1;
  float wheel_x;
  float scroll_step;
  float max_step;
  float wheel_y;
  ImVec2 offset;
  float scale;
  float new_font_scale;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff48;
  float local_a8;
  float local_a4;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff61;
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  undefined4 in_stack_ffffffffffffff64;
  float fVar15;
  ImGuiWindow *pIVar16;
  ImGuiCond cond;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ImGuiWindow *local_18;
  ImVec2 local_10;
  ImGuiContext *local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  
  local_8 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar2 = IsMousePosValid((ImVec2 *)
                            CONCAT44(in_stack_ffffffffffffff64,
                                     CONCAT13(in_stack_ffffffffffffff63,
                                              CONCAT12(in_stack_ffffffffffffff62,
                                                       CONCAT11(in_stack_ffffffffffffff61,
                                                                in_stack_ffffffffffffff60)))));
    in_stack_ffffffffffffff7f = false;
    if (bVar2) {
      auVar5._0_8_ = ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x1ba86e);
      auVar5._8_56_ = extraout_var;
      local_10 = (ImVec2)vmovlpd_avx(auVar5._0_16_);
      fVar15 = ImLengthSqr(&local_10);
      in_stack_ffffffffffffff7f =
           (local_8->IO).MouseDragThreshold * (local_8->IO).MouseDragThreshold < fVar15;
    }
    if ((bool)in_stack_ffffffffffffff7f != false) {
      local_8->WheelingWindowTimer = 0.0;
    }
    if (local_8->WheelingWindowTimer <= 0.0) {
      local_8->WheelingWindow = (ImGuiWindow *)0x0;
      local_8->WheelingWindowTimer = 0.0;
    }
  }
  fVar15 = (local_8->IO).MouseWheel;
  if (((((fVar15 != 0.0) || (NAN(fVar15))) || (fVar15 = (local_8->IO).MouseWheelH, fVar15 != 0.0))
      || (NAN(fVar15))) &&
     (((local_8->ActiveId == 0 || ((local_8->ActiveIdUsingMouseWheel & 1U) == 0)) &&
      ((local_8->HoveredIdPreviousFrame == 0 ||
       ((local_8->HoveredIdPreviousFrameUsingMouseWheel & 1U) == 0)))))) {
    if (local_8->WheelingWindow == (ImGuiWindow *)0x0) {
      local_18 = local_8->HoveredWindow;
    }
    else {
      local_18 = local_8->WheelingWindow;
    }
    if ((local_18 != (ImGuiWindow *)0x0) && ((local_18->Collapsed & 1U) == 0)) {
      fVar15 = (local_8->IO).MouseWheel;
      if (((fVar15 == 0.0) && (!NAN(fVar15))) ||
         ((((local_8->IO).KeyCtrl & 1U) == 0 || (((local_8->IO).FontAllowUserScaling & 1U) == 0))))
      {
        fVar15 = (local_8->IO).MouseWheel;
        if (((fVar15 == 0.0) && (!NAN(fVar15))) || (((local_8->IO).KeyShift & 1U) != 0)) {
          fVar15 = 0.0;
        }
        else {
          fVar15 = (local_8->IO).MouseWheel;
        }
        if (((fVar15 != 0.0) || (NAN(fVar15))) && (((local_8->IO).KeyCtrl & 1U) == 0)) {
          StartLockWheelingWindow(local_18);
          while( true ) {
            bVar2 = false;
            if ((local_18->Flags & 0x1000000U) != 0) {
              fVar4 = (local_18->ScrollMax).y;
              bVar2 = true;
              if (((fVar4 != 0.0) || (NAN(fVar4))) &&
                 (bVar2 = false, (local_18->Flags & 0x10U) != 0)) {
                bVar2 = (local_18->Flags & 0x200U) == 0;
              }
            }
            if (!bVar2) break;
            local_18 = local_18->ParentWindow;
          }
          if (((local_18->Flags & 0x10U) == 0) && ((local_18->Flags & 0x200U) == 0)) {
            fVar4 = ImRect::GetHeight(&local_18->InnerRect);
            fVar3 = ImGuiWindow::CalcFontSize(local_18);
            fVar4 = ImMin<float>(fVar3 * 5.0,fVar4 * 0.67);
            fVar4 = ImFloor(fVar4);
            SetScrollY(local_18,-fVar15 * fVar4 + (local_18->Scroll).y);
          }
        }
        fVar15 = (local_8->IO).MouseWheelH;
        if (((fVar15 == 0.0) && (!NAN(fVar15))) || (((local_8->IO).KeyShift & 1U) != 0)) {
          fVar15 = (local_8->IO).MouseWheel;
          if (((fVar15 == 0.0) && (!NAN(fVar15))) || (((local_8->IO).KeyShift & 1U) == 0)) {
            local_a8 = 0.0;
          }
          else {
            local_a8 = (local_8->IO).MouseWheel;
          }
          local_a4 = local_a8;
        }
        else {
          local_a4 = (local_8->IO).MouseWheelH;
        }
        if (((local_a4 != 0.0) || (NAN(local_a4))) && (((local_8->IO).KeyCtrl & 1U) == 0)) {
          StartLockWheelingWindow(local_18);
          while( true ) {
            bVar2 = false;
            if ((local_18->Flags & 0x1000000U) != 0) {
              fVar15 = (local_18->ScrollMax).x;
              bVar2 = true;
              if (((fVar15 != 0.0) || (NAN(fVar15))) &&
                 (bVar2 = false, (local_18->Flags & 0x10U) != 0)) {
                bVar2 = (local_18->Flags & 0x200U) == 0;
              }
            }
            if (!bVar2) break;
            local_18 = local_18->ParentWindow;
          }
          if (((local_18->Flags & 0x10U) == 0) && ((local_18->Flags & 0x200U) == 0)) {
            fVar15 = ImRect::GetWidth(&local_18->InnerRect);
            fVar15 = fVar15 * 0.67;
            fVar4 = ImGuiWindow::CalcFontSize(local_18);
            fVar15 = ImMin<float>(fVar4 * 2.0,fVar15);
            fVar15 = ImFloor(fVar15);
            SetScrollX(local_18,-local_a4 * fVar15 + (local_18->Scroll).x);
          }
        }
      }
      else {
        pIVar16 = local_18;
        StartLockWheelingWindow(local_18);
        cond = (ImGuiCond)((ulong)pIVar16 >> 0x20);
        fVar15 = ImClamp<float>((local_8->IO).MouseWheel * 0.1 + local_18->FontWindowScale,0.5,2.5);
        local_18->FontWindowScale = fVar15;
        if ((local_18->Flags & 0x1000000U) == 0) {
          auVar6._0_8_ = ::operator*(in_stack_ffffffffffffff48,0.0);
          auVar6._8_56_ = extraout_var_00;
          vmovlpd_avx(auVar6._0_16_);
          auVar7._0_8_ = ::operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x1bab3f);
          auVar7._8_56_ = extraout_var_01;
          vmovlpd_avx(auVar7._0_16_);
          auVar8._0_8_ = ::operator*(in_stack_ffffffffffffff48,(ImVec2 *)0x1bab57);
          auVar8._8_56_ = extraout_var_02;
          vmovlpd_avx(auVar8._0_16_);
          auVar9._0_8_ = operator/(in_stack_ffffffffffffff48,(ImVec2 *)0x1bab79);
          auVar9._8_56_ = extraout_var_03;
          vmovlpd_avx(auVar9._0_16_);
          auVar10._0_8_ = ::operator+(in_stack_ffffffffffffff48,(ImVec2 *)0x1baba0);
          auVar10._8_56_ = extraout_var_04;
          vmovlpd_avx(auVar10._0_16_);
          SetWindowPos((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (ImVec2 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),cond)
          ;
          auVar11._0_8_ = ::operator*(in_stack_ffffffffffffff48,0.0);
          auVar11._8_56_ = extraout_var_05;
          vmovlpd_avx(auVar11._0_16_);
          auVar12._0_8_ = ImFloor(in_stack_ffffffffffffff48);
          auVar12._8_56_ = extraout_var_06;
          IVar1 = (ImVec2)vmovlpd_avx(auVar12._0_16_);
          local_18->Size = IVar1;
          auVar13._0_8_ = ::operator*(in_stack_ffffffffffffff48,0.0);
          auVar13._8_56_ = extraout_var_07;
          vmovlpd_avx(auVar13._0_16_);
          auVar14._0_8_ = ImFloor(in_stack_ffffffffffffff48);
          auVar14._8_56_ = extraout_var_08;
          IVar1 = (ImVec2)vmovlpd_avx(auVar14._0_16_);
          local_18->SizeFull = IVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseWheel()
{
    ImGuiContext& g = *GImGui;

    // Reset the locked window if we move the mouse or after the timer elapses
    if (g.WheelingWindow != NULL)
    {
        g.WheelingWindowTimer -= g.IO.DeltaTime;
        if (IsMousePosValid() && ImLengthSqr(g.IO.MousePos - g.WheelingWindowRefMousePos) > g.IO.MouseDragThreshold * g.IO.MouseDragThreshold)
            g.WheelingWindowTimer = 0.0f;
        if (g.WheelingWindowTimer <= 0.0f)
        {
            g.WheelingWindow = NULL;
            g.WheelingWindowTimer = 0.0f;
        }
    }

    if (g.IO.MouseWheel == 0.0f && g.IO.MouseWheelH == 0.0f)
        return;

    if ((g.ActiveId != 0 && g.ActiveIdUsingMouseWheel) || (g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrameUsingMouseWheel))
        return;

    ImGuiWindow* window = g.WheelingWindow ? g.WheelingWindow : g.HoveredWindow;
    if (!window || window->Collapsed)
        return;

    // Zoom / Scale window
    // FIXME-OBSOLETE: This is an old feature, it still works but pretty much nobody is using it and may be best redesigned.
    if (g.IO.MouseWheel != 0.0f && g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
    {
        StartLockWheelingWindow(window);
        const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
        const float scale = new_font_scale / window->FontWindowScale;
        window->FontWindowScale = new_font_scale;
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow))
        {
            const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
            SetWindowPos(window, window->Pos + offset, 0);
            window->Size = ImFloor(window->Size * scale);
            window->SizeFull = ImFloor(window->SizeFull * scale);
        }
        return;
    }

    // Mouse wheel scrolling
    // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent

    // Vertical Mouse Wheel scrolling
    const float wheel_y = (g.IO.MouseWheel != 0.0f && !g.IO.KeyShift) ? g.IO.MouseWheel : 0.0f;
    if (wheel_y != 0.0f && !g.IO.KeyCtrl)
    {
        StartLockWheelingWindow(window);
        while ((window->Flags & ImGuiWindowFlags_ChildWindow) && ((window->ScrollMax.y == 0.0f) || ((window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))))
            window = window->ParentWindow;
        if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))
        {
            float max_step = window->InnerRect.GetHeight() * 0.67f;
            float scroll_step = ImFloor(ImMin(5 * window->CalcFontSize(), max_step));
            SetScrollY(window, window->Scroll.y - wheel_y * scroll_step);
        }
    }

    // Horizontal Mouse Wheel scrolling, or Vertical Mouse Wheel w/ Shift held
    const float wheel_x = (g.IO.MouseWheelH != 0.0f && !g.IO.KeyShift) ? g.IO.MouseWheelH : (g.IO.MouseWheel != 0.0f && g.IO.KeyShift) ? g.IO.MouseWheel : 0.0f;
    if (wheel_x != 0.0f && !g.IO.KeyCtrl)
    {
        StartLockWheelingWindow(window);
        while ((window->Flags & ImGuiWindowFlags_ChildWindow) && ((window->ScrollMax.x == 0.0f) || ((window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))))
            window = window->ParentWindow;
        if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(window->Flags & ImGuiWindowFlags_NoMouseInputs))
        {
            float max_step = window->InnerRect.GetWidth() * 0.67f;
            float scroll_step = ImFloor(ImMin(2 * window->CalcFontSize(), max_step));
            SetScrollX(window, window->Scroll.x - wheel_x * scroll_step);
        }
    }
}